

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch.h
# Opt level: O1

string * hashStr_abi_cxx11_(string *__return_storage_ptr__,uint32_t param_1)

{
  ulong uVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong *puVar11;
  string __str_1;
  string __str;
  long *local_f8;
  long local_e8;
  long lStack_e0;
  long *local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 uStack_c0;
  ulong *local_b8;
  long local_b0;
  ulong local_a8;
  long lStack_a0;
  ulong *local_98;
  uint local_90;
  undefined4 uStack_8c;
  ulong local_88 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  ulong *local_50;
  uint local_48;
  ulong local_40 [2];
  
  local_78 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_78;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "    static inline constexpr uint32_t hash(uint32_t a) noexcept{\n","");
  uVar8 = c._M_elems[1];
  uVar9 = c._M_elems[0];
  if ((c._M_elems[0] == 0) || (c._M_elems[1] == 0)) {
    if (c._M_elems[0] == 0) {
      if (c._M_elems[1] == 0) goto LAB_00106742;
      cVar4 = '\x01';
      if (9 < c._M_elems[1]) {
        uVar9 = c._M_elems[1];
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          if (uVar9 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_0010660a;
          }
          if (uVar9 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_0010660a;
          }
          if (uVar9 < 10000) goto LAB_0010660a;
          bVar2 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          cVar3 = cVar4 + '\x04';
        } while (bVar2);
        cVar4 = cVar4 + '\x01';
      }
LAB_0010660a:
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct((ulong)&local_b8,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,(uint)local_b0,uVar8);
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1163ca);
      local_d8 = &local_c8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_c8 = *plVar5;
        uStack_c0 = puVar6[3];
      }
      else {
        local_c8 = *plVar5;
        local_d8 = (long *)*puVar6;
      }
      local_d0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_f8 = &local_e8;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_e8 = *plVar7;
        lStack_e0 = plVar5[3];
      }
      else {
        local_e8 = *plVar7;
        local_f8 = (long *)*plVar5;
      }
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
    }
    else {
      cVar4 = '\x01';
      if (9 < c._M_elems[0]) {
        uVar8 = c._M_elems[0];
        cVar3 = '\x04';
        do {
          cVar4 = cVar3;
          if (uVar8 < 100) {
            cVar4 = cVar4 + -2;
            goto LAB_0010650b;
          }
          if (uVar8 < 1000) {
            cVar4 = cVar4 + -1;
            goto LAB_0010650b;
          }
          if (uVar8 < 10000) goto LAB_0010650b;
          bVar2 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          cVar3 = cVar4 + '\x04';
        } while (bVar2);
        cVar4 = cVar4 + '\x01';
      }
LAB_0010650b:
      local_b8 = &local_a8;
      std::__cxx11::string::_M_construct((ulong)&local_b8,cVar4);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,(uint)local_b0,uVar9);
      puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1163b8);
      local_d8 = &local_c8;
      plVar5 = puVar6 + 2;
      if ((long *)*puVar6 == plVar5) {
        local_c8 = *plVar5;
        uStack_c0 = puVar6[3];
      }
      else {
        local_c8 = *plVar5;
        local_d8 = (long *)*puVar6;
      }
      local_d0 = puVar6[1];
      *puVar6 = plVar5;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_f8 = &local_e8;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_e8 = *plVar7;
        lStack_e0 = plVar5[3];
      }
      else {
        local_e8 = *plVar7;
        local_f8 = (long *)*plVar5;
      }
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    local_40[0] = local_a8;
    puVar11 = local_b8;
    if (local_b8 == &local_a8) goto LAB_00106742;
  }
  else {
    cVar4 = '\x01';
    if (9 < c._M_elems[0]) {
      uVar8 = c._M_elems[0];
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_001061e3;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_001061e3;
        }
        if (uVar8 < 10000) goto LAB_001061e3;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_001061e3:
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_50,local_48,uVar9);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x11639a);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_60 = *plVar7;
      lStack_58 = plVar5[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar7;
      local_70 = (long *)*plVar5;
    }
    local_68 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
    puVar11 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar11) {
      local_a8 = *puVar11;
      lStack_a0 = plVar5[3];
      local_b8 = &local_a8;
    }
    else {
      local_a8 = *puVar11;
      local_b8 = (ulong *)*plVar5;
    }
    local_b0 = plVar5[1];
    *plVar5 = (long)puVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    uVar9 = c._M_elems[1];
    cVar4 = '\x01';
    if (9 < c._M_elems[1]) {
      uVar8 = c._M_elems[1];
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_0010632d;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_0010632d;
        }
        if (uVar8 < 10000) goto LAB_0010632d;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_0010632d:
    local_98 = local_88;
    std::__cxx11::string::_M_construct((ulong)&local_98,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,local_90,uVar9);
    uVar1 = CONCAT44(uStack_8c,local_90) + local_b0;
    uVar10 = 0xf;
    if (local_b8 != &local_a8) {
      uVar10 = local_a8;
    }
    if (uVar10 < uVar1) {
      uVar10 = 0xf;
      if (local_98 != local_88) {
        uVar10 = local_88[0];
      }
      if (uVar10 < uVar1) goto LAB_00106397;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_b8);
    }
    else {
LAB_00106397:
      puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
    }
    local_d8 = &local_c8;
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_c8 = *plVar5;
      uStack_c0 = puVar6[3];
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*puVar6;
    }
    local_d0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)plVar5 = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_e8 = *plVar7;
      lStack_e0 = plVar5[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar7;
      local_f8 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70,local_60 + 1);
    }
    puVar11 = local_50;
    if (local_50 == local_40) goto LAB_00106742;
  }
  operator_delete(puVar11,local_40[0] + 1);
LAB_00106742:
  uVar9 = c._M_elems[2];
  if (c._M_elems[2] != 0) {
    cVar4 = '\x01';
    if (9 < c._M_elems[2]) {
      uVar8 = c._M_elems[2];
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_0010679e;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_0010679e;
        }
        if (uVar8 < 10000) goto LAB_0010679e;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_0010679e:
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,(uint)local_b0,uVar9);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1163dd);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_c8 = *plVar5;
      uStack_c0 = puVar6[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*puVar6;
    }
    local_d0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_e8 = *plVar7;
      lStack_e0 = plVar5[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar7;
      local_f8 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
  }
  uVar9 = c._M_elems[3];
  if (c._M_elems[3] != 0) {
    cVar4 = '\x01';
    if (9 < c._M_elems[3]) {
      uVar8 = c._M_elems[3];
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_00106932;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_00106932;
        }
        if (uVar8 < 10000) goto LAB_00106932;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_00106932:
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,(uint)local_b0,uVar9);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1163ca);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_c8 = *plVar5;
      uStack_c0 = puVar6[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*puVar6;
    }
    local_d0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_e8 = *plVar7;
      lStack_e0 = plVar5[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar7;
      local_f8 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
  }
  if (c._M_elems[4] != 0) {
    uVar9 = c._M_elems[4] + 1;
    cVar4 = '\x01';
    if (9 < uVar9) {
      uVar8 = uVar9;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_00106ac8;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_00106ac8;
        }
        if (uVar8 < 10000) goto LAB_00106ac8;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_00106ac8:
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,(uint)local_b0,uVar9);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1163f0);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_c8 = *plVar5;
      uStack_c0 = puVar6[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*puVar6;
    }
    local_d0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_e8 = *plVar7;
      lStack_e0 = plVar5[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar7;
      local_f8 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
  }
  uVar9 = c._M_elems[5];
  if (c._M_elems[5] != 0) {
    cVar4 = '\x01';
    if (9 < c._M_elems[5]) {
      uVar8 = c._M_elems[5];
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar8 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_00106c5c;
        }
        if (uVar8 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_00106c5c;
        }
        if (uVar8 < 10000) goto LAB_00106c5c;
        bVar2 = 99999 < uVar8;
        uVar8 = uVar8 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_00106c5c:
    local_b8 = &local_a8;
    std::__cxx11::string::_M_construct((ulong)&local_b8,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b8,(uint)local_b0,uVar9);
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x1163ca);
    plVar5 = puVar6 + 2;
    if ((long *)*puVar6 == plVar5) {
      local_c8 = *plVar5;
      uStack_c0 = puVar6[3];
      local_d8 = &local_c8;
    }
    else {
      local_c8 = *plVar5;
      local_d8 = (long *)*puVar6;
    }
    local_d0 = puVar6[1];
    *puVar6 = plVar5;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_d8);
    plVar7 = plVar5 + 2;
    if ((long *)*plVar5 == plVar7) {
      local_e8 = *plVar7;
      lStack_e0 = plVar5[3];
      local_f8 = &local_e8;
    }
    else {
      local_e8 = *plVar7;
      local_f8 = (long *)*plVar5;
    }
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_f8);
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,local_e8 + 1);
    }
    if (local_d8 != &local_c8) {
      operator_delete(local_d8,local_c8 + 1);
    }
    if (local_b8 != &local_a8) {
      operator_delete(local_b8,local_a8 + 1);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string hashStr(uint32_t){
    std::string str =
"    static inline constexpr uint32_t hash(uint32_t a) noexcept{\n";
    if(c[0] && c[1])
        str += "        a =  (a ^ " + std::to_string(c[0]) + ") ^ (a >> " + std::to_string(c[1]) + ");\n";
    else if(c[0])
        str += "        a ^= a ^ " + std::to_string(c[0]) + ";\n";
    else if(c[1])
        str += "        a ^= a >> " + std::to_string(c[1]) + ";\n";

    if(c[2]) str += "        a += a << " + std::to_string(c[2]) + ";\n";
    if(c[3]) str += "        a ^= a >> " + std::to_string(c[3]) + ";\n";
    if(c[4]) str += "        a *= " + std::to_string(c[4]+1) + ";\n";
    if(c[5]) str += "        a ^= a >> " + std::to_string(c[5]) + ";\n";

    str += "        return a;\n"
           "    }\n";

    return str;
}